

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::save_graphicsmagick_external
          (CImg<unsigned_char> *this,char *filename,uint quality)

{
  undefined4 in_EAX;
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  FILE *pFVar6;
  CImgArgumentException *this_00;
  CImgIOException *this_01;
  pointer_____offset_0x10___ *ppuVar7;
  char *pcVar8;
  undefined1 auVar9 [16];
  char filetmp [512];
  char command [1024];
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    pcVar4 = "non-";
    if (this->_is_shared != false) {
      pcVar4 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_graphicsmagick_external() : Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar4,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
  }
  if ((this->_data == (uchar *)0x0) ||
     (auVar9._0_4_ = -(uint)(this->_width == 0), auVar9._4_4_ = -(uint)(this->_height == 0),
     auVar9._8_4_ = -(uint)(this->_depth == 0), auVar9._12_4_ = -(uint)(this->_spectrum == 0),
     uVar1 = movmskps(in_EAX,auVar9), (char)uVar1 != '\0')) {
    this_01 = (CImgIOException *)__cxa_allocate_exception(0x4008);
    pcVar4 = "non-";
    if (this->_is_shared != false) {
      pcVar4 = "";
    }
    CImgInstanceException::CImgInstanceException
              ((CImgInstanceException *)this_01,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_graphicsmagick_external() : Empty instance, for file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar4,"unsigned char",filename);
    ppuVar7 = &CImgInstanceException::typeinfo;
  }
  else {
    memset(command,0,0x400);
    memset(filetmp,0,0x200);
    pcVar4 = cimg::temporary_path((char *)0x0,false);
    pcVar5 = cimg::filenamerand();
    pcVar8 = "ppm";
    if (this->_spectrum == 1) {
      pcVar8 = "pgm";
    }
    snprintf(filetmp,0x200,"%s%c%s.%s",pcVar4,0x2f,pcVar5,pcVar8);
    pFVar6 = fopen(filetmp,"rb");
    if (pFVar6 != (FILE *)0x0) {
      do {
        if ((_stdin != pFVar6) && (_stdout != pFVar6)) {
          iVar2 = fclose(pFVar6);
          if (iVar2 != 0) {
            cimg::warn("cimg::fclose() : Error code %d returned during file closing.");
          }
        }
        pcVar4 = cimg::temporary_path((char *)0x0,false);
        pcVar5 = cimg::filenamerand();
        pcVar8 = "ppm";
        if (this->_spectrum == 1) {
          pcVar8 = "pgm";
        }
        snprintf(filetmp,0x200,"%s%c%s.%s",pcVar4,0x2f,pcVar5,pcVar8);
        pFVar6 = fopen(filetmp,"rb");
      } while (pFVar6 != (FILE *)0x0);
    }
    _save_pnm(this,(FILE *)0x0,filetmp,0);
    if (cimg::graphicsmagick_path(char_const*,bool)::st_path == (char *)0x0) {
      pcVar4 = (char *)operator_new__(0x400);
      cimg::graphicsmagick_path(char_const*,bool)::st_path = pcVar4;
      memset(pcVar4 + 5,0,0x3fb);
      builtin_strncpy(pcVar4,"./gm",5);
      pFVar6 = fopen(pcVar4,"r");
      pcVar4 = cimg::graphicsmagick_path(char_const*,bool)::st_path;
      if (pFVar6 == (FILE *)0x0) {
        cimg::graphicsmagick_path(char_const*,bool)::st_path[2] = '\0';
        pcVar4[0] = 'g';
        pcVar4[1] = 'm';
      }
      else if ((_stdin != pFVar6) && (_stdout != pFVar6)) {
        uVar3 = fclose(pFVar6);
        if (uVar3 != 0) {
          cimg::warn("cimg::fclose() : Error code %d returned during file closing.",(ulong)uVar3);
        }
      }
    }
    snprintf(command,0x400,"%s -quality %u%% \"%s\" \"%s\"",
             cimg::graphicsmagick_path(char_const*,bool)::st_path,(ulong)quality,filetmp,filename);
    system(command);
    pFVar6 = fopen(filename,"rb");
    if (pFVar6 != (FILE *)0x0) {
      if ((_stdin != pFVar6) && (_stdout != pFVar6)) {
        uVar3 = fclose(pFVar6);
        if (uVar3 != 0) {
          cimg::warn("cimg::fclose() : Error code %d returned during file closing.",(ulong)uVar3);
        }
      }
      remove(filetmp);
      return this;
    }
    this_01 = (CImgIOException *)__cxa_allocate_exception(0x4008);
    pcVar4 = "non-";
    if (this->_is_shared != false) {
      pcVar4 = "";
    }
    CImgIOException::CImgIOException
              (this_01,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_graphicsmagick_external() : Failed to save file \'%s\' with external command \'gm\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar4,"unsigned char",filename);
    ppuVar7 = &CImgIOException::typeinfo;
  }
  __cxa_throw(this_01,ppuVar7,std::exception::~exception);
}

Assistant:

const CImg<T>& save_graphicsmagick_external(const char *const filename, const unsigned int quality=100) const {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "save_graphicsmagick_external() : Specified filename is (null).",
                                    cimg_instance);
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "save_graphicsmagick_external() : Empty instance, for file '%s'.",
                                    cimg_instance,
                                    filename);

      char command[1024] = { 0 }, filetmp[512] = { 0 };
      std::FILE *file;
      do {
        cimg_snprintf(filetmp,sizeof(filetmp),"%s%c%s.%s",cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),_spectrum==1?"pgm":"ppm");
        if ((file=std::fopen(filetmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      save_pnm(filetmp);
      cimg_snprintf(command,sizeof(command),"%s -quality %u%% \"%s\" \"%s\"",cimg::graphicsmagick_path(),quality,filetmp,filename);
      cimg::system(command);
      file = std::fopen(filename,"rb");
      if (!file)
        throw CImgIOException(_cimg_instance
                              "save_graphicsmagick_external() : Failed to save file '%s' with external command 'gm'.",
                              cimg_instance,
                              filename);

      if (file) cimg::fclose(file);
      std::remove(filetmp);
      return *this;
    }